

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<wchar_t>
          (BasicWriter<wchar_t> *this,wchar_t *s,size_t size,AlignSpec *spec)

{
  long lVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t size_1;
  CharPtr __dest;
  int iVar18;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar10 = (ulong)(spec->super_WidthSpec).width_;
  puVar3 = *(undefined8 **)(this + 8);
  lVar4 = puVar3[2];
  if (size < uVar10) {
    uVar10 = uVar10 + lVar4;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
    }
    puVar3[2] = uVar10;
    auVar8 = _DAT_00146b70;
    auVar7 = _DAT_001429b0;
    auVar6 = _DAT_001429a0;
    lVar5 = *(long *)(*(long *)(this + 8) + 8);
    __dest = (CharPtr)(lVar5 + lVar4 * 4);
    uVar10 = (ulong)(spec->super_WidthSpec).width_;
    wVar2 = (spec->super_WidthSpec).fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar9 = uVar10 - size >> 1;
      if (1 < uVar10 - size) {
        uVar11 = uVar9 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar11;
        auVar23._0_8_ = uVar11;
        auVar23._12_4_ = (int)(uVar11 >> 0x20);
        lVar1 = lVar5 + lVar4 * 4;
        lVar12 = 0;
        auVar23 = auVar23 ^ _DAT_001429b0;
        do {
          auVar20._8_4_ = (int)lVar12;
          auVar20._0_8_ = lVar12;
          auVar20._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar24 = (auVar20 | auVar6) ^ auVar7;
          iVar18 = auVar23._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar18 && auVar23._0_4_ < auVar24._0_4_ ||
                      iVar18 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar12 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
              auVar24._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar12 * 4) = wVar2;
          }
          auVar20 = (auVar20 | auVar8) ^ auVar7;
          iVar25 = auVar20._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar20._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar12 * 4) = wVar2;
            *(wchar_t *)(lVar1 + 0xc + lVar12 * 4) = wVar2;
          }
          lVar12 = lVar12 + 4;
        } while ((uVar11 - ((uint)(uVar9 + 0x3fffffffffffffff) & 3)) + 4 != lVar12);
      }
      auVar8 = _DAT_00146b70;
      auVar7 = _DAT_001429b0;
      auVar6 = _DAT_001429a0;
      __dest = __dest + uVar9;
      if (uVar10 != size) {
        uVar10 = (uVar10 * 4 + (uVar9 + size) * -4) - 4;
        auVar24._8_4_ = (int)uVar10;
        auVar24._0_8_ = uVar10;
        auVar24._12_4_ = (int)(uVar10 >> 0x20);
        auVar15._0_8_ = uVar10 >> 2;
        auVar15._8_8_ = auVar24._8_8_ >> 2;
        lVar5 = lVar5 + size * 4 + lVar4 * 4 + uVar9 * 4;
        uVar9 = 0;
        auVar15 = auVar15 ^ _DAT_001429b0;
        do {
          auVar21._8_4_ = (int)uVar9;
          auVar21._0_8_ = uVar9;
          auVar21._12_4_ = (int)(uVar9 >> 0x20);
          auVar23 = (auVar21 | auVar6) ^ auVar7;
          iVar18 = auVar15._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar18 && auVar15._0_4_ < auVar23._0_4_ ||
                      iVar18 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar5 + uVar9 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar15._12_4_ || auVar23._8_4_ <= auVar15._8_4_) &&
              auVar23._12_4_ <= auVar15._12_4_) {
            *(wchar_t *)(lVar5 + 4 + uVar9 * 4) = wVar2;
          }
          auVar23 = (auVar21 | auVar8) ^ auVar7;
          iVar25 = auVar23._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar15._0_4_)) {
            *(wchar_t *)(lVar5 + 8 + uVar9 * 4) = wVar2;
            *(wchar_t *)(lVar5 + 0xc + uVar9 * 4) = wVar2;
          }
          uVar9 = uVar9 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar10 - size != 0) {
        uVar9 = (uVar10 * 4 + size * -4) - 4;
        auVar13._8_4_ = (int)uVar9;
        auVar13._0_8_ = uVar9;
        auVar13._12_4_ = (int)(uVar9 >> 0x20);
        auVar14._0_8_ = uVar9 >> 2;
        auVar14._8_8_ = auVar13._8_8_ >> 2;
        lVar5 = lVar5 + lVar4 * 4;
        uVar11 = 0;
        auVar14 = auVar14 ^ _DAT_001429b0;
        do {
          auVar19._8_4_ = (int)uVar11;
          auVar19._0_8_ = uVar11;
          auVar19._12_4_ = (int)(uVar11 >> 0x20);
          auVar23 = (auVar19 | auVar6) ^ auVar7;
          iVar18 = auVar14._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar18 && auVar14._0_4_ < auVar23._0_4_ ||
                      iVar18 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar5 + uVar11 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar14._12_4_ || auVar23._8_4_ <= auVar14._8_4_) &&
              auVar23._12_4_ <= auVar14._12_4_) {
            *(wchar_t *)(lVar5 + 4 + uVar11 * 4) = wVar2;
          }
          auVar23 = (auVar19 | auVar8) ^ auVar7;
          iVar25 = auVar23._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar14._0_4_)) {
            *(wchar_t *)(lVar5 + 8 + uVar11 * 4) = wVar2;
            *(wchar_t *)(lVar5 + 0xc + uVar11 * 4) = wVar2;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      }
      __dest = __dest + (uVar10 - size);
    }
    else if (uVar10 != size) {
      uVar10 = (uVar10 * 4 + size * -4) - 4;
      auVar16._8_4_ = (int)uVar10;
      auVar16._0_8_ = uVar10;
      auVar16._12_4_ = (int)(uVar10 >> 0x20);
      auVar17._0_8_ = uVar10 >> 2;
      auVar17._8_8_ = auVar16._8_8_ >> 2;
      lVar5 = lVar5 + size * 4 + lVar4 * 4;
      uVar9 = 0;
      auVar17 = auVar17 ^ _DAT_001429b0;
      do {
        auVar22._8_4_ = (int)uVar9;
        auVar22._0_8_ = uVar9;
        auVar22._12_4_ = (int)(uVar9 >> 0x20);
        auVar23 = (auVar22 | auVar6) ^ auVar7;
        iVar18 = auVar17._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar18 && auVar17._0_4_ < auVar23._0_4_ ||
                    iVar18 < auVar23._4_4_) & 1)) {
          *(wchar_t *)(lVar5 + uVar9 * 4) = wVar2;
        }
        if ((auVar23._12_4_ != auVar17._12_4_ || auVar23._8_4_ <= auVar17._8_4_) &&
            auVar23._12_4_ <= auVar17._12_4_) {
          *(wchar_t *)(lVar5 + 4 + uVar9 * 4) = wVar2;
        }
        auVar23 = (auVar22 | auVar8) ^ auVar7;
        iVar25 = auVar23._4_4_;
        if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar17._0_4_)) {
          *(wchar_t *)(lVar5 + 8 + uVar9 * 4) = wVar2;
          *(wchar_t *)(lVar5 + 0xc + uVar9 * 4) = wVar2;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
    }
  }
  else {
    uVar10 = lVar4 + size;
    if ((ulong)puVar3[3] < uVar10) {
      (**(code **)*puVar3)(puVar3,uVar10);
    }
    puVar3[2] = uVar10;
    __dest = (CharPtr)(lVar4 * 4 + *(long *)(*(long *)(this + 8) + 8));
  }
  if (size != 0) {
    memmove(__dest,s,size << 2);
  }
  return __dest;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}